

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse_levinson_durbin_recursion.cc
# Opt level: O0

bool __thiscall
sptk::ReverseLevinsonDurbinRecursion::Run
          (ReverseLevinsonDurbinRecursion *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *autocorrelation,Buffer *buffer)

{
  int iVar1;
  size_type sVar2;
  double *pdVar3;
  long in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar4;
  int j_3;
  double sum;
  int i_1;
  int j_2;
  double t;
  double *u;
  int i;
  int j_1;
  int j;
  double *e;
  double *r;
  double *a;
  int length;
  double in_stack_fffffffffffffe58;
  Row *in_stack_fffffffffffffe60;
  SymmetricMatrix *in_stack_fffffffffffffe68;
  size_type in_stack_fffffffffffffe78;
  SymmetricMatrix *in_stack_fffffffffffffe80;
  Row local_128;
  Row local_110;
  int local_f4;
  double local_f0;
  int local_e4;
  Row local_e0;
  int local_c4;
  double local_c0;
  Row local_b8;
  double *local_a0;
  int local_94;
  Row local_90;
  int local_78;
  Row local_68;
  int local_4c;
  value_type *local_48;
  reference local_40;
  double *local_38;
  int local_2c;
  long local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  
  local_2c = *(int *)(in_RDI + 8) + 1;
  if (((((*(byte *)(in_RDI + 0xc) & 1) != 0) &&
       (local_28 = in_RCX, local_20 = in_RDX, local_18 = in_RSI,
       sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar2 == (long)local_2c))
      && (local_20 != (vector<double,_std::allocator<double>_> *)0x0)) && (local_28 != 0)) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(local_20);
    if (sVar2 != (long)local_2c) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
    }
    iVar1 = SymmetricMatrix::GetNumDimension((SymmetricMatrix *)(local_28 + 8));
    if (iVar1 != local_2c) {
      SymmetricMatrix::Resize(in_stack_fffffffffffffe80,(int)(in_stack_fffffffffffffe78 >> 0x20));
    }
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(local_28 + 0x48));
    if (sVar2 != (long)local_2c) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
    }
    local_38 = std::vector<double,_std::allocator<double>_>::operator[](local_18,0);
    local_40 = std::vector<double,_std::allocator<double>_>::operator[](local_20,0);
    local_48 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_28 + 0x48),0);
    for (local_4c = 0; iVar1 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
        local_4c <= *(int *)(in_RDI + 8); local_4c = local_4c + 1) {
      SymmetricMatrix::operator[]
                (in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      pdVar3 = SymmetricMatrix::Row::operator[](in_stack_fffffffffffffe60,iVar1);
      *pdVar3 = 1.0;
      SymmetricMatrix::Row::~Row(&local_68);
    }
    for (local_78 = 0; local_78 < *(int *)(in_RDI + 8); local_78 = local_78 + 1) {
      dVar4 = local_38[*(int *)(in_RDI + 8) - local_78];
      SymmetricMatrix::operator[]
                (in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      pdVar3 = SymmetricMatrix::Row::operator[](in_stack_fffffffffffffe60,iVar1);
      *pdVar3 = dVar4;
      SymmetricMatrix::Row::~Row(&local_90);
    }
    local_48[*(int *)(in_RDI + 8)] = *local_38 * *local_38;
    local_94 = *(int *)(in_RDI + 8);
    while (local_94 = local_94 + -1, -1 < local_94) {
      SymmetricMatrix::operator[]
                (in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      pdVar3 = SymmetricMatrix::Row::operator[](in_stack_fffffffffffffe60,iVar1);
      SymmetricMatrix::Row::~Row(&local_b8);
      local_c0 = 1.0 / (-*pdVar3 * *pdVar3 + 1.0);
      local_a0 = pdVar3;
      for (local_c4 = 0; local_c4 < local_94; local_c4 = local_c4 + 1) {
        dVar4 = (local_a0[(long)local_c4 + 1] - *local_a0 * local_a0[local_94 - local_c4]) *
                local_c0;
        SymmetricMatrix::operator[]
                  (in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        pdVar3 = SymmetricMatrix::Row::operator[](in_stack_fffffffffffffe60,iVar1);
        *pdVar3 = dVar4;
        SymmetricMatrix::Row::~Row(&local_e0);
      }
      local_48[local_94] = local_48[local_94 + 1] * local_c0;
    }
    *local_40 = *local_48;
    for (local_e4 = 1; local_e4 <= *(int *)(in_RDI + 8); local_e4 = local_e4 + 1) {
      local_f0 = 0.0;
      for (local_f4 = 1; dVar4 = local_f0, local_f4 < local_e4; local_f4 = local_f4 + 1) {
        SymmetricMatrix::operator[]
                  (in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        pdVar3 = SymmetricMatrix::Row::operator[]
                           (in_stack_fffffffffffffe60,
                            (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
        local_f0 = *pdVar3 * local_40[local_e4 - local_f4] + local_f0;
        SymmetricMatrix::Row::~Row(&local_110);
      }
      in_stack_fffffffffffffe60 = &local_128;
      SymmetricMatrix::operator[]
                (in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      in_stack_fffffffffffffe68 =
           (SymmetricMatrix *)
           SymmetricMatrix::Row::operator[](in_stack_fffffffffffffe60,(int)((ulong)dVar4 >> 0x20));
      local_40[local_e4] =
           -((double)in_stack_fffffffffffffe68->_vptr_SymmetricMatrix * local_48[local_e4 + -1] +
            dVar4);
      SymmetricMatrix::Row::~Row(&local_128);
      in_stack_fffffffffffffe58 = dVar4;
    }
    return true;
  }
  return false;
}

Assistant:

bool ReverseLevinsonDurbinRecursion::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* autocorrelation,
    ReverseLevinsonDurbinRecursion::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(length) ||
      NULL == autocorrelation || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (autocorrelation->size() != static_cast<std::size_t>(length)) {
    autocorrelation->resize(length);
  }
  if (buffer->u_.GetNumDimension() != length) {
    buffer->u_.Resize(length);
  }
  if (buffer->e_.size() != static_cast<std::size_t>(length)) {
    buffer->e_.resize(length);
  }

  const double* a(&(linear_predictive_coefficients[0]));
  double* r(&((*autocorrelation)[0]));
  double* e(&(buffer->e_[0]));

  for (int j(0); j <= num_order_; ++j) {
    buffer->u_[j][j] = 1.0;
  }
  for (int j(0); j < num_order_; ++j) {
    buffer->u_[num_order_][j] = a[num_order_ - j];
  }
  e[num_order_] = a[0] * a[0];

  for (int i(num_order_ - 1); 0 <= i; --i) {
    const double* u(&(buffer->u_[i + 1][0]));
    const double t(1.0 / (1.0 - u[0] * u[0]));
    for (int j(0); j < i; ++j) {
      buffer->u_[i][j] = (u[j + 1] - u[0] * u[i - j]) * t;
    }
    e[i] = e[i + 1] * t;
  }

  r[0] = e[0];
  for (int i(1); i <= num_order_; ++i) {
    double sum(0.0);
    for (int j(1); j < i; ++j) {
      sum += buffer->u_[i - 1][i - j - 1] * r[i - j];
    }
    r[i] = -(sum + buffer->u_[i][0] * e[i - 1]);
  }

  return true;
}